

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

OutputInfo * __thiscall cmGeneratorTarget::GetOutputInfo(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  iterator iVar3;
  cmake *this_00;
  long *plVar4;
  ulong *puVar5;
  OutputInfo *pOVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_bool>
  pVar7;
  string config_upper;
  OutputInfo info;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  key_type local_130;
  OutputInfo local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
  local_b0;
  
  if (this->Target->IsImportedTarget != false) {
    return (OutputInfo *)0x0;
  }
  if (MODULE_LIBRARY < this->Target->TargetTypeValue) {
    paVar1 = &local_b0.first.field_2;
    local_b0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"cmGeneratorTarget::GetOutputInfo called for ","");
    std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(this->Target->Name)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_b0);
    cmState::GetTargetTypeName(this->Target->TargetTypeValue);
    std::__cxx11::string::append((char *)&local_b0);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,&local_b0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p == paVar1) {
      return (OutputInfo *)0x0;
    }
    operator_delete(local_b0.first._M_dataplus._M_p,local_b0.first.field_2._M_allocated_capacity + 1
                   );
    return (OutputInfo *)0x0;
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  if (config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_b0.first,config);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>_>_>
          ::find(&(this->OutputInfoMap)._M_t,&local_130);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header)
  {
    local_110.OutDir._M_dataplus._M_p = (pointer)&local_110.OutDir.field_2;
    local_110.OutDir._M_string_length = 0;
    local_110.OutDir.field_2._M_allocated_capacity =
         local_110.OutDir.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_110.ImpDir._M_dataplus._M_p = (pointer)&local_110.ImpDir.field_2;
    local_110.ImpDir._M_string_length = 0;
    local_110.ImpDir.field_2._M_local_buf[0] = '\0';
    local_110.PdbDir._M_dataplus._M_p = (pointer)&local_110.PdbDir.field_2;
    local_110.PdbDir._M_string_length = 0;
    local_110.PdbDir.field_2._M_local_buf[0] = '\0';
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::OutputInfo>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::OutputInfo_&,_true>
              (&local_b0,&local_130,&local_110);
    pVar7 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
            ::
            _M_emplace_unique<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::OutputInfo>>>
                        *)&this->OutputInfoMap,&local_b0);
    iVar3._M_node = (_Base_ptr)pVar7.first._M_node;
    ComputeOutputDir(this,config,false,&local_110.OutDir);
    ComputeOutputDir(this,config,true,&local_110.ImpDir);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"PDB","");
    bVar2 = ComputePDBOutputDir(this,&local_150,config,&local_110.PdbDir);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      std::__cxx11::string::_M_assign((string *)&local_110.PdbDir);
    }
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 2));
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 3));
    std::__cxx11::string::_M_assign((string *)(iVar3._M_node + 4));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.PdbDir._M_dataplus._M_p != &local_b0.second.PdbDir.field_2) {
      operator_delete(local_b0.second.PdbDir._M_dataplus._M_p,
                      local_b0.second.PdbDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.ImpDir._M_dataplus._M_p != &local_b0.second.ImpDir.field_2) {
      operator_delete(local_b0.second.ImpDir._M_dataplus._M_p,
                      local_b0.second.ImpDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.second.OutDir._M_dataplus._M_p != &local_b0.second.OutDir.field_2) {
      operator_delete(local_b0.second.OutDir._M_dataplus._M_p,
                      local_b0.second.OutDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
      operator_delete(local_b0.first._M_dataplus._M_p,
                      local_b0.first.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.PdbDir._M_dataplus._M_p != &local_110.PdbDir.field_2) {
      operator_delete(local_110.PdbDir._M_dataplus._M_p,
                      CONCAT71(local_110.PdbDir.field_2._M_allocated_capacity._1_7_,
                               local_110.PdbDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.ImpDir._M_dataplus._M_p != &local_110.ImpDir.field_2) {
      operator_delete(local_110.ImpDir._M_dataplus._M_p,
                      CONCAT71(local_110.ImpDir.field_2._M_allocated_capacity._1_7_,
                               local_110.ImpDir.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.OutDir._M_dataplus._M_p != &local_110.OutDir.field_2) {
      operator_delete(local_110.OutDir._M_dataplus._M_p,
                      local_110.OutDir.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((iVar3._M_node[3]._M_parent == (_Base_ptr)0x0 &&
            iVar3._M_node[2]._M_parent == (_Base_ptr)0x0) &&
          (iVar3._M_node[4]._M_parent == (_Base_ptr)0x0)) {
    this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::operator+(&local_150,"Target \'",&this->Target->Name);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
    paVar1 = &local_110.OutDir.field_2;
    puVar5 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar5) {
      local_110.OutDir.field_2._M_allocated_capacity = *puVar5;
      local_110.OutDir.field_2._8_8_ = plVar4[3];
      local_110.OutDir._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_110.OutDir.field_2._M_allocated_capacity = *puVar5;
      local_110.OutDir._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_110.OutDir._M_string_length = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    GetBacktrace((cmListFileBacktrace *)&local_b0,this);
    cmake::IssueMessage(this_00,FATAL_ERROR,&local_110.OutDir,(cmListFileBacktrace *)&local_b0,false
                       );
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110.OutDir._M_dataplus._M_p != paVar1) {
      operator_delete(local_110.OutDir._M_dataplus._M_p,
                      local_110.OutDir.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    pOVar6 = (OutputInfo *)0x0;
    goto LAB_0033aa47;
  }
  pOVar6 = (OutputInfo *)(iVar3._M_node + 2);
LAB_0033aa47:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
    return pOVar6;
  }
  return pOVar6;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}